

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O2

int jpc_ns_analyze(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  jpc_fix_t *pjVar5;
  ulong uVar6;
  jpc_fix_t *pjVar7;
  long *plVar8;
  jpc_fix_t *pjVar9;
  long lVar10;
  jpc_fix_t *pjVar11;
  jpc_fix_t *pjVar12;
  int iVar13;
  jpc_fix_t *pjVar14;
  int iVar15;
  jpc_fix_t *pjVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint parity;
  int iVar20;
  jpc_fix_t *a_00;
  uint uVar21;
  uint uVar22;
  bool bVar23;
  uint llen;
  jpc_fix_t *local_90;
  uint local_88;
  jpc_fix_t *local_58;
  
  parity = ystart & 1;
  uVar17 = (height - parity) + 1 >> 1;
  uVar6 = (ulong)(uVar17 * stride);
  uVar21 = height & 1;
  uVar19 = (uint)(uVar21 == parity);
  uVar22 = (uint)(uVar21 != parity);
  iVar13 = ((height - uVar17) - parity) - uVar19;
  iVar18 = (uVar17 - (parity == 0)) - uVar22;
  uVar4 = (ulong)((((byte)((char)ystart + 1) & 1) + height >> 1) * stride);
  pjVar14 = a + uVar4;
  local_58 = a + (uint)stride + uVar4;
  pjVar12 = a + (uint)stride + uVar6;
  local_90 = a + (uint)stride;
  pjVar9 = a + uVar6;
  a_00 = a;
  for (uVar2 = 0; uVar2 < (width & 0xfffffff0U); uVar2 = uVar2 + 0x10) {
    jpc_qmfb_split_colgrp(a_00,height,stride,parity);
    if (1 < (uint)height) {
      pjVar5 = a_00 + uVar6;
      pjVar7 = pjVar5;
      pjVar11 = a_00;
      pjVar16 = local_90;
      iVar15 = iVar13;
      if (parity != 0) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          a_00[uVar6 + lVar10] = a_00[uVar6 + lVar10] + (a_00[lVar10] * -0x6583 >> 0xd);
        }
        pjVar7 = pjVar5 + (uint)stride;
      }
      while (iVar15 != 0) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          pjVar7[lVar10] = pjVar7[lVar10] + ((pjVar16[lVar10] + pjVar11[lVar10]) * -0x32c1 >> 0xd);
        }
        pjVar7 = pjVar7 + (uint)stride;
        pjVar11 = pjVar11 + (uint)stride;
        pjVar16 = pjVar16 + (uint)stride;
        iVar15 = iVar15 + -1;
      }
      if (uVar21 == parity) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          pjVar7[lVar10] = pjVar7[lVar10] + (pjVar11[lVar10] * -0x6583 >> 0xd);
        }
      }
      pjVar7 = a_00;
      pjVar11 = pjVar9;
      pjVar16 = pjVar12;
      iVar15 = iVar18;
      if (parity == 0) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          a_00[lVar10] = a_00[lVar10] + (a_00[uVar6 + lVar10] * -0x364 >> 0xd);
        }
        pjVar7 = a_00 + (uint)stride;
      }
      while (iVar15 != 0) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          pjVar7[lVar10] = pjVar7[lVar10] + ((pjVar16[lVar10] + pjVar11[lVar10]) * -0x1b2 >> 0xd);
        }
        pjVar7 = pjVar7 + (uint)stride;
        pjVar11 = pjVar11 + (uint)stride;
        pjVar16 = pjVar16 + (uint)stride;
        iVar15 = iVar15 + -1;
      }
      if (uVar21 != parity) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          pjVar7[lVar10] = pjVar7[lVar10] + (pjVar11[lVar10] * -0x364 >> 0xd);
        }
      }
      pjVar7 = a_00;
      pjVar11 = local_90;
      iVar15 = iVar13;
      if (parity != 0) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          a_00[uVar6 + lVar10] = a_00[uVar6 + lVar10] + (a_00[lVar10] * 0x3881 >> 0xd);
        }
        pjVar5 = pjVar5 + (uint)stride;
      }
      while (iVar15 != 0) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          pjVar5[lVar10] = pjVar5[lVar10] + ((pjVar11[lVar10] + pjVar7[lVar10]) * 0x1c40 >> 0xd);
        }
        pjVar5 = pjVar5 + (uint)stride;
        pjVar7 = pjVar7 + (uint)stride;
        pjVar11 = pjVar11 + (uint)stride;
        iVar15 = iVar15 + -1;
      }
      if (uVar21 == parity) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          pjVar5[lVar10] = pjVar5[lVar10] + (pjVar7[lVar10] * 0x3881 >> 0xd);
        }
      }
      pjVar5 = a_00;
      pjVar7 = pjVar9;
      pjVar11 = pjVar12;
      iVar15 = iVar18;
      if (parity == 0) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          a_00[lVar10] = a_00[lVar10] + (a_00[uVar6 + lVar10] * 0x1c62 >> 0xd);
        }
        pjVar5 = a_00 + (uint)stride;
      }
      while (iVar15 != 0) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          pjVar5[lVar10] = pjVar5[lVar10] + ((pjVar11[lVar10] + pjVar7[lVar10]) * 0xe31 >> 0xd);
        }
        pjVar5 = pjVar5 + (uint)stride;
        pjVar7 = pjVar7 + (uint)stride;
        pjVar11 = pjVar11 + (uint)stride;
        iVar15 = iVar15 + -1;
      }
      pjVar11 = a_00;
      uVar3 = uVar17;
      if (uVar21 != parity) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          pjVar5[lVar10] = pjVar5[lVar10] + (pjVar7[lVar10] * 0x1c62 >> 0xd);
        }
      }
      while (pjVar5 = pjVar9, iVar15 = height - uVar17, uVar3 != 0) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          pjVar11[lVar10] = pjVar11[lVar10] * 0x1a03 >> 0xd;
        }
        pjVar11 = pjVar11 + (uint)stride;
        uVar3 = uVar3 - 1;
      }
      while (iVar15 != 0) {
        for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
          pjVar5[lVar10] = pjVar5[lVar10] * 0x13ae >> 0xd;
        }
        pjVar5 = pjVar5 + (uint)stride;
        iVar15 = iVar15 + -1;
      }
    }
    a_00 = a_00 + 0x10;
    pjVar14 = pjVar14 + 0x10;
    local_58 = local_58 + 0x10;
    local_90 = local_90 + 0x10;
    pjVar12 = pjVar12 + 0x10;
    pjVar9 = pjVar9 + 0x10;
  }
  uVar2 = xstart & 1;
  if ((width & 0xfffffff0U) != width) {
    uVar17 = width & 0xf;
    local_88 = ystart & 1;
    jpc_qmfb_split_colres(a_00,height,uVar17,stride,parity);
    if (1 < (uint)height) {
      uVar3 = (local_88 ^ 1) + height >> 1;
      pjVar12 = a_00 + uVar3 * stride;
      pjVar9 = pjVar12;
      if (local_88 != 0) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          a_00[uVar4 + lVar10] = a_00[uVar4 + lVar10] + (a_00[lVar10] * -0x6583 >> 0xd);
        }
        pjVar9 = pjVar12 + (uint)stride;
      }
      iVar15 = height - uVar3;
      iVar18 = (iVar15 - local_88) - uVar19;
      pjVar5 = a_00;
      pjVar7 = local_90;
      iVar13 = iVar18;
      while (bVar23 = iVar13 != 0, iVar13 = iVar13 + -1, bVar23) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          pjVar9[lVar10] = pjVar9[lVar10] + ((pjVar7[lVar10] + pjVar5[lVar10]) * -0x32c1 >> 0xd);
        }
        pjVar5 = pjVar5 + (uint)stride;
        pjVar9 = pjVar9 + (uint)stride;
        pjVar7 = pjVar7 + (uint)stride;
      }
      if (uVar21 == local_88) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          pjVar9[lVar10] = pjVar9[lVar10] + (pjVar5[lVar10] * -0x6583 >> 0xd);
        }
      }
      pjVar9 = a_00;
      if (local_88 == 0) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          a_00[lVar10] = a_00[lVar10] + (a_00[uVar4 + lVar10] * -0x364 >> 0xd);
        }
        pjVar9 = a_00 + (uint)stride;
      }
      iVar20 = (uVar3 - (parity == 0)) - uVar22;
      pjVar5 = pjVar14;
      pjVar7 = local_58;
      iVar13 = iVar20;
      while (bVar23 = iVar13 != 0, iVar13 = iVar13 + -1, bVar23) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          pjVar9[lVar10] = pjVar9[lVar10] + ((pjVar7[lVar10] + pjVar5[lVar10]) * -0x1b2 >> 0xd);
        }
        pjVar9 = pjVar9 + (uint)stride;
        pjVar5 = pjVar5 + (uint)stride;
        pjVar7 = pjVar7 + (uint)stride;
      }
      if (uVar21 != local_88) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          pjVar9[lVar10] = pjVar9[lVar10] + (pjVar5[lVar10] * -0x364 >> 0xd);
        }
      }
      pjVar9 = a_00;
      if (local_88 != 0) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          a_00[uVar4 + lVar10] = a_00[uVar4 + lVar10] + (a_00[lVar10] * 0x3881 >> 0xd);
        }
        pjVar12 = pjVar12 + (uint)stride;
      }
      while (bVar23 = iVar18 != 0, iVar18 = iVar18 + -1, bVar23) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          pjVar12[lVar10] = pjVar12[lVar10] + ((local_90[lVar10] + pjVar9[lVar10]) * 0x1c40 >> 0xd);
        }
        pjVar12 = pjVar12 + (uint)stride;
        local_90 = local_90 + (uint)stride;
        pjVar9 = pjVar9 + (uint)stride;
      }
      if (uVar21 == local_88) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          pjVar12[lVar10] = pjVar12[lVar10] + (pjVar9[lVar10] * 0x3881 >> 0xd);
        }
      }
      pjVar9 = a_00;
      pjVar12 = pjVar14;
      if (local_88 == 0) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          a_00[lVar10] = a_00[lVar10] + (a_00[uVar4 + lVar10] * 0x1c62 >> 0xd);
        }
        pjVar9 = a_00 + (uint)stride;
      }
      while (bVar23 = iVar20 != 0, iVar20 = iVar20 + -1, bVar23) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          pjVar9[lVar10] = pjVar9[lVar10] + ((local_58[lVar10] + pjVar12[lVar10]) * 0xe31 >> 0xd);
        }
        local_58 = local_58 + (uint)stride;
        pjVar9 = pjVar9 + (uint)stride;
        pjVar12 = pjVar12 + (uint)stride;
      }
      if (uVar21 != local_88) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          pjVar9[lVar10] = pjVar9[lVar10] + (pjVar12[lVar10] * 0x1c62 >> 0xd);
        }
      }
      while (bVar23 = uVar3 != 0, uVar3 = uVar3 - 1, bVar23) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          a_00[lVar10] = a_00[lVar10] * 0x1a03 >> 0xd;
        }
        a_00 = a_00 + (uint)stride;
      }
      while (bVar23 = iVar15 != 0, iVar15 = iVar15 + -1, bVar23) {
        for (lVar10 = 0; uVar17 != (uint)lVar10; lVar10 = lVar10 + 1) {
          pjVar14[lVar10] = pjVar14[lVar10] * 0x13ae >> 0xd;
        }
        pjVar14 = pjVar14 + (uint)stride;
      }
    }
  }
  uVar19 = (uVar2 ^ 1) + width >> 1;
  uVar4 = (ulong)uVar19;
  uVar22 = width & 1;
  iVar15 = ((width - uVar19) - uVar2) - (uint)(uVar22 == uVar2);
  pjVar14 = a + uVar4;
  iVar18 = ((uVar22 != uVar2) - uVar19) + (uint)(uVar2 == 0);
  for (iVar13 = 0; iVar13 != height; iVar13 = iVar13 + 1) {
    jpc_qmfb_split_row(a,width,uVar2);
    if (1 < (uint)width) {
      plVar1 = a + uVar4;
      plVar8 = plVar1;
      if (uVar2 != 0) {
        *plVar1 = *plVar1 + (*a * -0x6583 >> 0xd);
        plVar8 = plVar1 + 1;
      }
      for (lVar10 = 0; iVar15 != (int)lVar10; lVar10 = lVar10 + 1) {
        plVar8[lVar10] = plVar8[lVar10] + ((a[lVar10 + 1] + a[lVar10]) * -0x32c1 >> 0xd);
      }
      if (uVar22 == uVar2) {
        plVar8[lVar10] = plVar8[lVar10] + (a[lVar10] * -0x6583 >> 0xd);
      }
      pjVar9 = a;
      if (uVar2 == 0) {
        *a = *a + (*plVar1 * -0x364 >> 0xd);
        pjVar9 = a + 1;
      }
      for (lVar10 = 0; iVar18 + (int)lVar10 != 0; lVar10 = lVar10 + 1) {
        pjVar9[lVar10] = pjVar9[lVar10] + ((pjVar14[lVar10 + 1] + pjVar14[lVar10]) * -0x1b2 >> 0xd);
      }
      if (uVar22 != uVar2) {
        pjVar9[lVar10] = pjVar9[lVar10] + (pjVar14[lVar10] * -0x364 >> 0xd);
      }
      plVar8 = plVar1;
      if (uVar2 != 0) {
        *plVar1 = *plVar1 + (*a * 0x3881 >> 0xd);
        plVar8 = plVar1 + 1;
      }
      for (lVar10 = 0; iVar15 != (int)lVar10; lVar10 = lVar10 + 1) {
        plVar8[lVar10] = plVar8[lVar10] + ((a[lVar10 + 1] + a[lVar10]) * 0x1c40 >> 0xd);
      }
      if (uVar22 == uVar2) {
        plVar8[lVar10] = plVar8[lVar10] + (a[lVar10] * 0x3881 >> 0xd);
      }
      pjVar9 = a;
      if (uVar2 == 0) {
        *a = *a + (*plVar1 * 0x1c62 >> 0xd);
        pjVar9 = a + 1;
      }
      for (lVar10 = 0; iVar18 + (int)lVar10 != 0; lVar10 = lVar10 + 1) {
        pjVar9[lVar10] = pjVar9[lVar10] + ((pjVar14[lVar10 + 1] + pjVar14[lVar10]) * 0xe31 >> 0xd);
      }
      if (uVar22 != uVar2) {
        pjVar9[lVar10] = pjVar9[lVar10] + (pjVar14[lVar10] * 0x1c62 >> 0xd);
      }
      for (lVar10 = 0; uVar6 = uVar4, uVar19 != (uint)lVar10; lVar10 = lVar10 + 1) {
        a[lVar10] = a[lVar10] * 0x1a03 >> 0xd;
      }
      for (; width != (int)uVar6; uVar6 = uVar6 + 1) {
        a[uVar6] = a[uVar6] * 0x13ae >> 0xd;
      }
    }
    a = a + stride;
    pjVar14 = pjVar14 + stride;
  }
  return 0;
}

Assistant:

int jpc_ns_analyze(jpc_fix_t *a, int xstart, int ystart, int width, int height,
  int stride)
{

	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;
	jpc_fix_t *startptr;

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_qmfb_split_colgrp(startptr, numrows, stride, rowparity);
		jpc_ns_fwdlift_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_qmfb_split_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_ns_fwdlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_qmfb_split_row(startptr, numcols, colparity);
		jpc_ns_fwdlift_row(startptr, numcols, colparity);
		startptr += stride;
	}

	return 0;

}